

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O0

void class2(int *ip)

{
  int iVar1;
  uint data;
  uint addr;
  int *ip_local;
  
  loccnt = loccnt + 2;
  iVar1 = evaluate(ip,';');
  if ((iVar1 != 0) && (pass == 1)) {
    putbyte(data_loccnt,opval);
    data = value - (loccnt + page * 0x2000);
    if ((data < 0x80) || (0xffffff7f < data)) {
      putbyte(data_loccnt + 1,data);
      println();
    }
    else {
      error("Branch address out of range!");
    }
  }
  return;
}

Assistant:

void
class2(int *ip)
{
	unsigned int addr;

	/* update location counter */
	loccnt += 2;

	/* get destination address */
	if (!evaluate(ip, ';'))
		return;

	/* generate code */
	if (pass == LAST_PASS) {
		/* opcode */
		putbyte(data_loccnt, opval);

		/* calculate branch offset */
		addr = value - (loccnt + (page << 13));

		/* check range */
		if (addr > 0x7F && addr < 0xFFFFFF80) {
			error("Branch address out of range!");
			return;
		}

		/* offset */
		putbyte(data_loccnt+1, addr);

		/* output line */
		println();
	}
}